

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

LoopBlocks * __thiscall spv::Builder::makeNewLoop(Builder *this)

{
  Block *head_00;
  Block *body_00;
  Block *merge_00;
  reference pvVar1;
  undefined1 local_50 [8];
  LoopBlocks blocks;
  Block *continue_target;
  Block *merge;
  Block *body;
  Block *head;
  Builder *this_local;
  
  head_00 = makeNewBlock(this);
  body_00 = makeNewBlock(this);
  merge_00 = makeNewBlock(this);
  blocks.continue_target = makeNewBlock(this);
  LoopBlocks::LoopBlocks((LoopBlocks *)local_50,head_00,body_00,merge_00,blocks.continue_target);
  std::
  stack<spv::Builder::LoopBlocks,_std::deque<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>_>
  ::push(&this->loops,(value_type *)local_50);
  pvVar1 = std::
           stack<spv::Builder::LoopBlocks,_std::deque<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>_>
           ::top(&this->loops);
  return pvVar1;
}

Assistant:

Builder::LoopBlocks& Builder::makeNewLoop()
{
    // This verbosity is needed to simultaneously get the same behavior
    // everywhere (id's in the same order), have a syntax that works
    // across lots of versions of C++, have no warnings from pedantic
    // compilation modes, and leave the rest of the code alone.
    Block& head            = makeNewBlock();
    Block& body            = makeNewBlock();
    Block& merge           = makeNewBlock();
    Block& continue_target = makeNewBlock();
    LoopBlocks blocks(head, body, merge, continue_target);
    loops.push(blocks);
    return loops.top();
}